

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::has_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration)

{
  bool bVar1;
  Meta *pMVar2;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)id);
  if (pMVar2 != (Meta *)0x0) {
    bVar1 = Bitset::get(&(pMVar2->decoration).extended.flags,decoration);
    return bVar1;
  }
  return false;
}

Assistant:

bool Compiler::has_extended_decoration(uint32_t id, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return false;

	auto &dec = m->decoration;
	return dec.extended.flags.get(decoration);
}